

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_getmountpoint(char *args)

{
  size_t sVar1;
  undefined8 uVar2;
  char *__s;
  
  __s = args;
  if (*args == '\"') {
    __s = args + 1;
    sVar1 = strlen(__s);
    args[sVar1] = '\0';
  }
  uVar2 = PHYSFS_getMountPoint(__s);
  printf("Dir [%s] is mounted at [%s].\n",__s,uVar2);
  return 1;
}

Assistant:

static int cmd_getmountpoint(char *args)
{
    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    printf("Dir [%s] is mounted at [%s].\n", args, PHYSFS_getMountPoint(args));
    return 1;
}